

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

void __thiscall QMYSQLResult::cleanup(QMYSQLResult *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QMYSQLResultPrivate *pQVar2;
  long lVar3;
  QMYSQLDriverPrivate *pQVar4;
  ulong uVar5;
  const_iterator o;
  QMyField *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QMyField *f;
  add_const_t<QList<QMYSQLResultPrivate::QMyField>_> *__range1;
  MYSQL_RES *res;
  QMYSQLResultPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff58;
  QMYSQLResultPrivate *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  const_iterator local_40;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMYSQLResult *)0x10a500);
  if (pQVar2->result != (MYSQL_RES *)0x0) {
    mysql_free_result(pQVar2->result);
  }
  while( true ) {
    lVar3 = QSqlResult::driver();
    bVar7 = false;
    if (lVar3 != 0) {
      pQVar4 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff60);
      bVar7 = false;
      if (pQVar4->mysql != (MYSQL *)0x0) {
        pQVar4 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff60);
        iVar1 = mysql_next_result(pQVar4->mysql);
        bVar7 = iVar1 == 0;
      }
    }
    if (!bVar7) break;
    pQVar4 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff60);
    lVar3 = mysql_store_result(pQVar4->mysql);
    if (lVar3 != 0) {
      mysql_free_result(lVar3);
    }
  }
  if (pQVar2->stmt != (MYSQL_STMT *)0x0) {
    uVar5 = FUN_00107dd0(pQVar2->stmt);
    if ((uVar5 & 1) != 0) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      lcMysql();
      anon_unknown.dwarf_33943::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
      while (bVar7 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar7) {
        anon_unknown.dwarf_33943::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x10a639);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(char *)in_stack_ffffffffffffff58
                   ,(char *)0x10a64f);
        QMessageLogger::warning(local_38,"QMYSQLResult::cleanup: unable to free statement handle");
        local_10 = local_10 & 0xffffffffffffff00;
      }
    }
    pQVar2->stmt = (MYSQL_STMT *)0x0;
  }
  if (pQVar2->meta != (MYSQL_RES *)0x0) {
    mysql_free_result(pQVar2->meta);
    pQVar2->meta = (MYSQL_RES *)0x0;
  }
  local_40.i = (QMyField *)0xaaaaaaaaaaaaaaaa;
  local_40 = QList<QMYSQLResultPrivate::QMyField>::begin
                       ((QList<QMYSQLResultPrivate::QMyField> *)in_stack_ffffffffffffff60);
  o = QList<QMYSQLResultPrivate::QMyField>::end
                ((QList<QMYSQLResultPrivate::QMyField> *)in_stack_ffffffffffffff60);
  while (bVar7 = QList<QMYSQLResultPrivate::QMyField>::const_iterator::operator!=(&local_40,o),
        bVar7) {
    pQVar6 = QList<QMYSQLResultPrivate::QMyField>::const_iterator::operator*(&local_40);
    if (pQVar6->outField != (char *)0x0) {
      operator_delete__(pQVar6->outField);
    }
    QList<QMYSQLResultPrivate::QMyField>::const_iterator::operator++(&local_40);
  }
  if (pQVar2->outBinds != (MYSQL_BIND *)0x0) {
    if (pQVar2->outBinds != (MYSQL_BIND *)0x0) {
      operator_delete__(pQVar2->outBinds);
    }
    pQVar2->outBinds = (MYSQL_BIND *)0x0;
  }
  if (pQVar2->inBinds != (MYSQL_BIND *)0x0) {
    in_stack_ffffffffffffff60 = (QMYSQLResultPrivate *)pQVar2->inBinds;
    if (in_stack_ffffffffffffff60 != (QMYSQLResultPrivate *)0x0) {
      operator_delete__(in_stack_ffffffffffffff60);
    }
    pQVar2->inBinds = (MYSQL_BIND *)0x0;
  }
  pQVar2->hasBlobs = false;
  QList<QMYSQLResultPrivate::QMyField>::clear
            ((QList<QMYSQLResultPrivate::QMyField> *)in_stack_ffffffffffffff60);
  pQVar2->result = (MYSQL_RES *)0x0;
  pQVar2->row = (MYSQL_ROW)0x0;
  (**(code **)(*(long *)this + 0x18))(this,0xffffffff);
  (**(code **)(*(long *)this + 0x20))(this,0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMYSQLResult::cleanup()
{
    Q_D(QMYSQLResult);
    if (d->result)
        mysql_free_result(d->result);

// must iterate through leftover result sets from multi-selects or stored procedures
// if this isn't done subsequent queries will fail with "Commands out of sync"
    while (driver() && d->drv_d_func()->mysql && mysql_next_result(d->drv_d_func()->mysql) == 0) {
        MYSQL_RES *res = mysql_store_result(d->drv_d_func()->mysql);
        if (res)
            mysql_free_result(res);
    }

    if (d->stmt) {
        if (mysql_stmt_close(d->stmt))
            qCWarning(lcMysql, "QMYSQLResult::cleanup: unable to free statement handle");
        d->stmt = 0;
    }

    if (d->meta) {
        mysql_free_result(d->meta);
        d->meta = 0;
    }

    for (const QMYSQLResultPrivate::QMyField &f : std::as_const(d->fields))
        delete[] f.outField;

    if (d->outBinds) {
        delete[] d->outBinds;
        d->outBinds = 0;
    }

    if (d->inBinds) {
        delete[] d->inBinds;
        d->inBinds = 0;
    }

    d->hasBlobs = false;
    d->fields.clear();
    d->result = nullptr;
    d->row = nullptr;
    setAt(-1);
    setActive(false);
}